

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

png_handle_result_code png_handle_sRGB(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  png_handle_result_code pVar2;
  png_byte intent;
  byte local_19;
  
  png_crc_read(png_ptr,&local_19,1);
  iVar1 = png_crc_finish_critical(png_ptr,0,0);
  pVar2 = handled_error;
  if (iVar1 == 0) {
    if (local_19 < 4) {
      png_set_sRGB(png_ptr,info_ptr,(uint)local_19);
      if (((png_ptr->chunks & 0x80) == 0) || (pVar2 = handled_ok, png_ptr->chunk_gamma == 0)) {
        png_ptr->chunk_gamma = 0xb18f;
        pVar2 = handled_ok;
      }
    }
    else {
      png_chunk_benign_error(png_ptr,"invalid");
      pVar2 = handled_error;
    }
  }
  return pVar2;
}

Assistant:

static png_handle_result_code /* PRIVATE */
png_handle_sRGB(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte intent;

   png_debug(1, "in png_handle_sRGB");

   png_crc_read(png_ptr, &intent, 1);

   if (png_crc_finish(png_ptr, 0) != 0)
      return handled_error;

   /* This checks the range of the "rendering intent" because it is specified in
    * the PNG spec itself; the "reserved" values will result in the chunk not
    * being accepted, just as they do with the various "reserved" values in
    * IHDR.
    */
   if (intent > 3/*PNGv3 spec*/)
   {
      png_chunk_benign_error(png_ptr, "invalid");
      return handled_error;
   }

   png_set_sRGB(png_ptr, info_ptr, intent);
   /* NOTE: png_struct::chromaticities is not set here because the RGB to gray
    * coefficients are known without a need for the chromaticities.
    */

#ifdef PNG_READ_GAMMA_SUPPORTED
      /* PNGv3: chunk precedence for gamma is cICP, [iCCP], sRGB, gAMA.  iCCP is
       * not supported by libpng so the only requirement is to check for cICP
       * setting the gamma (this is NYI, but this check is safe.)
       */
      if (!png_has_chunk(png_ptr, cICP) || png_ptr->chunk_gamma == 0)
         png_ptr->chunk_gamma = PNG_GAMMA_sRGB_INVERSE;
#endif /*READ_GAMMA*/

   return handled_ok;
   PNG_UNUSED(length)
}